

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

int __thiscall
PrintMenu::clone(PrintMenu *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PrintMenu *this_00;
  
  this_00 = (PrintMenu *)operator_new(0x30);
  PrintMenu(this_00,this);
  return (int)this_00;
}

Assistant:

BaseAction *PrintMenu::clone() {
    return (new PrintMenu(*this));
}